

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool __thiscall
google::anon_unknown_10::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  int __fd;
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  undefined1 __from [8];
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string linkname;
  undefined1 local_70 [8];
  string string_filename;
  string linkpath;
  
  std::__cxx11::string::string((string *)local_70,&this->base_filename_);
  if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               time_pid_string);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             &this->filename_extension_);
  __fd = open((char *)local_70,(uint)fLB::FLAGS_timestamp_in_logfile_name << 7 | 0x41,
              (ulong)fLI::FLAGS_logfile_mode);
  if (__fd != -1) {
    fcntl(__fd,2,1);
    CreateLogfile::w_lock.l_type = 1;
    CreateLogfile::w_lock.l_whence = 0;
    CreateLogfile::w_lock.l_start = 0;
    CreateLogfile::w_lock.l_len = 0;
    iVar1 = fcntl(__fd,6,&CreateLogfile::w_lock);
    if (iVar1 == -1) {
      close(__fd);
    }
    else {
      pFVar2 = fdopen(__fd,"a");
      this->file_ = (FILE *)pFVar2;
      if (pFVar2 != (FILE *)0x0) {
        bVar4 = true;
        if ((this->symlink_basename_)._M_string_length != 0) {
          pcVar3 = strrchr((char *)local_70,0x2f);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&string_filename.field_2 + 8),&this->symlink_basename_,'.');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&string_filename.field_2 + 8),
                         *(char **)(LogSeverityNames + (long)this->severity_ * 8));
          std::__cxx11::string::~string((string *)(string_filename.field_2._M_local_buf + 8));
          string_filename.field_2._8_8_ = &linkpath._M_string_length;
          linkpath._M_dataplus._M_p = (pointer)0x0;
          linkpath._M_string_length._0_1_ = 0;
          if (pcVar3 != (char *)0x0) {
            linkname.field_2._8_8_ = &stack0xffffffffffffff80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&linkname.field_2 + 8),local_70,pcVar3 + 1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&string_filename.field_2 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (linkname.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(linkname.field_2._M_local_buf + 8));
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&string_filename.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
          unlink((char *)string_filename.field_2._8_8_);
          __from = (undefined1  [8])(pcVar3 + 1);
          if (pcVar3 == (char *)0x0) {
            __from = local_70;
          }
          symlink((char *)__from,(char *)string_filename.field_2._8_8_);
          if (fLS::FLAGS_log_link_abi_cxx11_->_M_string_length != 0) {
            std::operator+(&local_d0,fLS::FLAGS_log_link_abi_cxx11_,"/");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&linkname.field_2 + 8),&local_d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&string_filename.field_2 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (linkname.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(linkname.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_d0);
            unlink((char *)string_filename.field_2._8_8_);
            symlink((char *)local_70,(char *)string_filename.field_2._8_8_);
          }
          std::__cxx11::string::~string((string *)(string_filename.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_b0);
        }
        goto LAB_0011b061;
      }
      close(__fd);
      if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
        unlink((char *)local_70);
      }
    }
  }
  bVar4 = false;
LAB_0011b061:
  std::__cxx11::string::~string((string *)local_70);
  return bVar4;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  string string_filename = base_filename_;
  if (FLAGS_timestamp_in_logfile_name) {
    string_filename += time_pid_string;
  }
  string_filename += filename_extension_;
  const char* filename = string_filename.c_str();
  //only write to files, create if non-existant.
  int flags = O_WRONLY | O_CREAT;
  if (FLAGS_timestamp_in_logfile_name) {
    //demand that the file is unique for our timestamp (fail if it exists).
    flags = flags | O_EXCL;
  }
  int fd = open(filename, flags, FLAGS_logfile_mode);
  if (fd == -1) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd, F_SETFD, FD_CLOEXEC);

  // Mark the file as exclusive write access to avoid two clients logging to the
  // same file. This applies particularly when !FLAGS_timestamp_in_logfile_name
  // (otherwise open would fail because the O_EXCL flag on similar filename).
  // locks are released on unlock or close() automatically, only after log is
  // released.
  // This will work after a fork as it is not inherited (not stored in the fd).
  // Lock will not be lost because the file is opened with exclusive lock (write)
  // and we will never read from it inside the process.
  // TODO windows implementation of this (as flock is not available on mingw).
  static struct flock w_lock;

  w_lock.l_type = F_WRLCK;
  w_lock.l_start = 0;
  w_lock.l_whence = SEEK_SET;
  w_lock.l_len = 0;

  int wlock_ret = fcntl(fd, F_SETLK, &w_lock);
  if (wlock_ret == -1) {
      close(fd); //as we are failing already, do not check errors here
      return false;
  }
#endif

  //fdopen in append mode so if the file exists it will fseek to the end
  file_ = fdopen(fd, "a");  // Make a FILE*.
  if (file_ == NULL) {  // Man, we're screwed!
    close(fd);
    if (FLAGS_timestamp_in_logfile_name) {
      unlink(filename);  // Erase the half-baked evidence: an unusable log file, only if we just created it.
    }
    return false;
  }
#ifdef GLOG_OS_WINDOWS
  // https://github.com/golang/go/issues/27638 - make sure we seek to the end to append
  // empirically replicated with wine over mingw build
  if (!FLAGS_timestamp_in_logfile_name) {
    if (fseek(file_, 0, SEEK_END) != 0) {
      return false;
    }
  }
#endif
  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
      symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if ( slash ) linkpath = string(filename, static_cast<size_t>(slash-filename+1));  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());                    // delete old one if it exists

#if defined(GLOG_OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char *linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());                  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}